

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationEntry.h
# Opt level: O3

void __thiscall
cmDocumentationEntry::cmDocumentationEntry(cmDocumentationEntry *this,char *n,char *b)

{
  char *pcVar1;
  
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Brief)._M_dataplus._M_p = (pointer)&(this->Brief).field_2;
  (this->Brief)._M_string_length = 0;
  (this->Brief).field_2._M_local_buf[0] = '\0';
  this->CustomNamePrefix = ' ';
  if (n != (char *)0x0) {
    strlen(n);
    std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,(ulong)n);
  }
  if (b != (char *)0x0) {
    pcVar1 = (char *)(this->Brief)._M_string_length;
    strlen(b);
    std::__cxx11::string::_M_replace((ulong)&this->Brief,0,pcVar1,(ulong)b);
  }
  return;
}

Assistant:

cmDocumentationEntry(const char* n, const char* b)
  {
    if (n) {
      this->Name = n;
    }
    if (b) {
      this->Brief = b;
    }
  }